

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseEncoder.cpp
# Opt level: O3

void __thiscall siamese::EncoderPacketWindow::EncoderPacketWindow(EncoderPacketWindow *this)

{
  EncoderColumnLane *pEVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint *puVar4;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [16];
  
  (this->Subwindows).Size = 0;
  lVar5 = 0x118;
  this->TheAllocator = (Allocator *)0x0;
  this->Stats = (EncoderStats *)0x0;
  this->NextColumn = 0;
  this->Count = 0;
  this->ColumnStart = 0;
  this->LongestPacket = 0;
  this->Count = 0;
  this->ColumnStart = 0;
  this->LongestPacket = 0;
  this->FirstUnremovedElement = 0;
  this->SumStartElement = 0;
  this->SumEndElement = 0;
  this->SumColumnStart = 0;
  this->SumErasedCount = 0;
  (this->Subwindows).Allocated = 0x19;
  (this->Subwindows).DataPtr = (this->Subwindows).PreallocatedData;
  puVar4 = &this->Lanes[0].Sum[0].Bytes;
  do {
    lVar6 = 0;
    do {
      *(undefined8 *)((long)puVar4 + lVar6 + -8) = 0;
      *(undefined4 *)((long)puVar4 + lVar6) = 0;
      lVar6 = lVar6 + 0x10;
    } while (lVar6 != 0x30);
    *(undefined4 *)((long)(this->Subwindows).PreallocatedData + lVar5 + 8) = 0;
    lVar5 = lVar5 + 0x48;
    puVar4 = puVar4 + 0x12;
  } while (lVar5 != 0x358);
  auVar3 = vpmovsxbd_avx(ZEXT416(0x30201000));
  (this->SubwindowsShift).Size = 0;
  (this->SubwindowsShift).Allocated = 0x19;
  (this->SubwindowsShift).DataPtr = (this->SubwindowsShift).PreallocatedData;
  this->EmergencyDisabled = false;
  puVar4 = &this->Lanes[0].LongestPacket;
  this->LongestPacket = 0;
  this->FirstUnremovedElement = 0;
  this->SumStartElement = 0;
  this->SumEndElement = 0;
  this->NextColumn = 0;
  this->Count = 0;
  this->ColumnStart = 0;
  this->LongestPacket = 0;
  lVar5 = 0;
  do {
    auVar7 = vpbroadcastd_avx512vl();
    lVar5 = lVar5 + 1;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = puVar4;
    vpscatterdd_avx512vl
              (auVar2 + ZEXT816(0xffffffffffffffd8) + auVar3,
               CONCAT71((int7)((ulong)&this->SubwindowsShift >> 8),7) & 0xffffffff,
               (undefined1  [16])0x0);
    pEVar1 = (EncoderColumnLane *)(puVar4 + -0x10);
    auVar2 = vmovdqu32_avx512vl(auVar7);
    pEVar1->NextElement[0] = auVar2._0_4_;
    pEVar1->NextElement[1] = auVar2._4_4_;
    pEVar1->NextElement[2] = auVar2._8_4_;
    *(int *)&pEVar1->field_0xc = auVar2._12_4_;
    *puVar4 = 0;
    puVar4 = puVar4 + 0x12;
  } while (lVar5 != 8);
  return;
}

Assistant:

EncoderPacketWindow::EncoderPacketWindow()
{
    NextColumn  = 0;
    ColumnStart = 0;

    ClearWindow();
}